

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
  *alns_seq;
  long *plVar4;
  initializer_list<long> __l;
  maybe<example::aln_t> x;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_9f8;
  long *local_9d8;
  iterator iStack_9d0;
  long *local_9c8;
  anon_union_16_2_edcbc2ec_for_maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_1
  *local_9c0;
  anon_union_128_2_edcbc2ec_for_maybe<example::aln_t>_1 local_9b8;
  bool local_938;
  long local_930;
  int local_928;
  _Alloc_hider local_920;
  size_type local_918;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_910;
  uint local_900;
  _Alloc_hider local_8f8;
  size_type local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e8;
  uint local_8d8;
  pos_t local_8d0;
  pos_t pStack_8c8;
  pos_t local_8c0;
  int64_t iStack_8b8;
  undefined1 local_8b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  undefined4 local_880;
  string local_878 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868 [4];
  anon_union_16_2_edcbc2ec_for_maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_1
  aaStack_828 [35];
  _Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>
  local_5f0;
  pointer local_5e0;
  pointer paStack_5d8;
  pointer local_5d0;
  pointer local_5c8;
  pointer paStack_5c0;
  pointer local_5b8;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_5a8;
  bool local_590;
  iterator local_588;
  _Mem_fn<int_example::aln_t::*> _Stack_580;
  pointer local_570;
  pointer paStack_568;
  pointer local_560;
  pointer local_558;
  pointer paStack_550;
  pointer local_548;
  _func_vector<example::aln_t,_std::allocator<example::aln_t>_>_vector<example::aln_t,_std::allocator<example::aln_t>_>
  *p_Stack_540;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_538;
  bool local_520;
  iterator local_518;
  bool local_510;
  bool bStack_50f;
  bool local_50e;
  anon_union_128_2_edcbc2ec_for_maybe<example::aln_t>_1 local_508;
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  gStack_480;
  _Mem_fn_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*,_false>
  local_248;
  pointer local_238;
  pointer paStack_230;
  pointer local_228;
  pointer local_220;
  pointer paStack_218;
  pointer local_210;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_200;
  char local_1e8;
  aln_t *local_1e0;
  _Mem_fn_base<int_example::aln_t::*,_false> _Stack_1d8;
  pointer local_1c8;
  pointer paStack_1c0;
  pointer local_1b8;
  pointer local_1b0;
  pointer paStack_1a8;
  pointer local_1a0;
  _func_vector<example::aln_t,_std::allocator<example::aln_t>_>_vector<example::aln_t,_std::allocator<example::aln_t>_>
  *p_Stack_198;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_190;
  char local_178;
  aln_t *local_170;
  bool local_168;
  bool bStack_167;
  undefined1 local_166;
  maybe<example::aln_t> local_160;
  element_type *local_d8;
  undefined3 uStack_d0;
  undefined5 uStack_cd;
  undefined1 local_c8;
  undefined2 uStack_c7;
  undefined5 uStack_c5;
  undefined2 local_c0;
  undefined1 local_be;
  maybe<example::aln_t> local_b8;
  
  local_9f8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_9f8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9f8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b0._0_8_ = 0x65;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000001","");
  local_880 = 2;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x66;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000001","");
  local_880 = 2;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x67;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000001","");
  local_880 = 2;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 0xf4241;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 0x32;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x68;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000001","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0xc9;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000002","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x12d;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000003","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x191;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000004","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x1f5;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000005","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 0x6e;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x321;
  local_8b0._8_4_ = 2;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000008","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18768;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = 0x259;
  local_8b0._8_4_ = 3;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000005","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NC_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_8b0._0_8_ = (void *)0x2bd;
  local_8b0._8_4_ = 3;
  local_8b0._16_8_ = &local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_8b0 + 0x10),"NM_000007","");
  local_880 = 1;
  local_878._0_8_ = local_868;
  std::__cxx11::string::_M_construct<char_const*>(local_878,"NT_000001","");
  local_868[1]._0_4_ = 1;
  local_868[1]._8_8_ = 1000000;
  local_868[2]._0_8_ = 0xf4628;
  local_868[2]._8_8_ = 0x18704;
  local_868[3]._0_8_ = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_9f8,(aln_t *)local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._0_8_ != local_868) {
    operator_delete((void *)local_878._0_8_,local_868[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._16_8_ != &local_890) {
    operator_delete((void *)local_8b0._16_8_,local_890._M_allocated_capacity + 1);
  }
  local_9c8 = (long *)0x0;
  local_9d8 = (long *)0x0;
  iStack_9d0._M_current = (long *)0x0;
  local_160.m_empty = true;
  local_d8 = (element_type *)0x0;
  uStack_d0 = SUB83(&local_9f8,0);
  uStack_cd = (undefined5)((ulong)&local_9f8 >> 0x18);
  local_c8 = 0;
  local_c0 = 0;
  local_be = 0;
  rangeless::fn::impl::maybe<example::aln_t>::maybe((maybe<example::aln_t> *)local_8b0,&local_160);
  aaStack_828[1]._8_2_ = local_c0;
  aaStack_828[1]._3_5_ = uStack_c5;
  aaStack_828[1]._10_1_ = local_be;
  aaStack_828[1]._0_3_ = (undefined3)(CONCAT26(uStack_c7,CONCAT15(local_c8,uStack_cd)) >> 0x28);
  aaStack_828[0].m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_d8;
  aaStack_828[0]._8_3_ = uStack_d0;
  aaStack_828[0]._11_5_ = uStack_cd;
  example::$_7::operator()
            ((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
              *)&local_508.m_value,(__7 *)local_8b0,alns_seq);
  rangeless::fn::impl::maybe<example::aln_t>::reset((maybe<example::aln_t> *)local_8b0);
  rangeless::fn::impl::maybe<example::aln_t>::maybe
            ((maybe<example::aln_t> *)local_8b0,(maybe<example::aln_t> *)&local_508.m_value);
  local_9c0 = aaStack_828;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_9c0->m_value,&gStack_480);
  local_5f0.
  super__Mem_fn_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*,_false>
  ._M_pm = (_Mem_fn_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*,_false>
            )(_Mem_fn_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*,_false>
              )local_248._M_pm;
  local_5e0 = local_238;
  paStack_5d8 = paStack_230;
  local_5d0 = local_228;
  local_238 = (pointer)0x0;
  paStack_230 = (pointer)0x0;
  local_228 = (pointer)0x0;
  local_5c8 = local_220;
  paStack_5c0 = paStack_218;
  local_5b8 = local_210;
  local_220 = (pointer)0x0;
  paStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  local_590 = true;
  if (local_1e8 == '\0') {
    local_5a8.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_200.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_5a8.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_200.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_5a8.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_200.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_200.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_200.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_200.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_590 = false;
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_200.m_value);
    local_1e8 = '\x01';
  }
  local_588._M_current = local_1e0;
  _Stack_580.super__Mem_fn_base<int_example::aln_t::*,_false>._M_pm =
       (_Mem_fn_base<int_example::aln_t::*,_false>)
       (_Mem_fn_base<int_example::aln_t::*,_false>)_Stack_1d8._M_pm;
  local_570 = local_1c8;
  paStack_568 = paStack_1c0;
  local_560 = local_1b8;
  local_1c8 = (pointer)0x0;
  paStack_1c0 = (pointer)0x0;
  local_1b8 = (pointer)0x0;
  local_558 = local_1b0;
  paStack_550 = paStack_1a8;
  local_548 = local_1a0;
  p_Stack_540 = p_Stack_198;
  local_1b0 = (pointer)0x0;
  paStack_1a8 = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  local_520 = true;
  if (local_178 == '\0') {
    local_538.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_190.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_538.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_190.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_538.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_190.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_190.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_190.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_190.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_520 = false;
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_190.m_value);
    local_178 = '\x01';
  }
  local_518._M_current = local_170;
  local_510 = local_168;
  bStack_50f = bStack_167;
  local_50e = (bool)local_166;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::operator()((maybe<example::aln_t> *)&local_9b8,
               (gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                *)&local_9c0->m_value);
  if (local_938 == false) {
    do {
      local_928 = local_9b8.m_value.gene_id;
      local_930 = local_9b8.m_value.aln_id;
      if (local_9b8.m_value.mrna_id.first._M_dataplus._M_p ==
          (_Alloc_hider)((long)&local_9b8.m_value + 0x20U)) {
        local_910._8_8_ = local_9b8._40_8_;
        local_920._M_p = (pointer)&local_910;
      }
      else {
        local_920._M_p = (pointer)local_9b8.m_value.mrna_id.first._M_dataplus._M_p;
      }
      local_910._M_allocated_capacity._1_7_ = local_9b8._33_7_;
      local_910._M_local_buf[0] = local_9b8._32_1_;
      local_918 = local_9b8.m_value.mrna_id.first._M_string_length;
      local_9b8.m_value.mrna_id.first._M_string_length = 0;
      local_9b8._32_1_ = 0;
      local_900 = local_9b8.m_value.mrna_id.second;
      if (local_9b8.m_value.chr_id.first._M_dataplus._M_p ==
          (_Alloc_hider)((long)&local_9b8.m_value + 0x48U)) {
        local_8e8._8_8_ = local_9b8._80_8_;
        local_8f8._M_p = (pointer)&local_8e8;
      }
      else {
        local_8f8._M_p = (pointer)local_9b8.m_value.chr_id.first._M_dataplus._M_p;
      }
      local_8e8._M_allocated_capacity._1_7_ = local_9b8._73_7_;
      local_8e8._M_local_buf[0] = local_9b8._72_1_;
      local_8f0 = local_9b8.m_value.chr_id.first._M_string_length;
      local_9b8.m_value.chr_id.first._M_string_length = 0;
      local_9b8._72_1_ = 0;
      local_8d8 = local_9b8.m_value.chr_id.second;
      local_8c0 = local_9b8.m_value.chr_cds_start_pos;
      iStack_8b8 = local_9b8.m_value.score;
      local_8d0 = local_9b8.m_value.chr_start;
      pStack_8c8 = local_9b8.m_value.chr_stop;
      local_9b8.m_value.mrna_id.first._M_dataplus._M_p =
           (_Alloc_hider)((long)&local_9b8.m_value + 0x20U);
      local_9b8.m_value.chr_id.first._M_dataplus._M_p =
           (_Alloc_hider)((long)&local_9b8.m_value + 0x48U);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_9b8.m_value.gene_id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (iStack_9d0._M_current == local_9c8) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_9d8,iStack_9d0,&local_930);
      }
      else {
        *iStack_9d0._M_current = local_930;
        iStack_9d0._M_current = iStack_9d0._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f8._M_p != &local_8e8) {
        operator_delete(local_8f8._M_p,local_8e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920._M_p != &local_910) {
        operator_delete(local_920._M_p,local_910._M_allocated_capacity + 1);
      }
      if (local_938 == true) {
        __assert_fail("!m_empty",
                      "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                      ,199,
                      "T &rangeless::fn::impl::maybe<example::aln_t>::operator*() [T = example::aln_t]"
                     );
      }
      rangeless::fn::impl::concat::
      gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
      ::operator()(&local_b8,
                   (gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                    *)&local_9c0->m_value);
      rangeless::fn::impl::maybe<example::aln_t>::operator=
                ((maybe<example::aln_t> *)&local_9b8,&local_b8);
      rangeless::fn::impl::maybe<example::aln_t>::reset(&local_b8);
    } while (local_938 == false);
  }
  rangeless::fn::impl::maybe<example::aln_t>::reset((maybe<example::aln_t> *)&local_9b8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_8b0);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)&local_508.m_value);
  rangeless::fn::impl::maybe<example::aln_t>::reset(&local_160);
  local_508.m_value.aln_id = 0x1f5;
  local_508._8_8_ = 0x65;
  local_508.m_value.mrna_id.first._M_dataplus._M_p = (_Alloc_hider)(pointer)0x259;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_508;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_8b0,__l,(allocator_type *)&local_160);
  uVar1 = local_8b0._0_8_;
  plVar4 = local_9d8;
  if ((long)iStack_9d0._M_current - (long)local_9d8 ==
      CONCAT44(local_8b0._12_4_,local_8b0._8_4_) - local_8b0._0_8_) {
    if (iStack_9d0._M_current != local_9d8) {
      iVar2 = bcmp(local_9d8,(void *)local_8b0._0_8_,(long)iStack_9d0._M_current - (long)local_9d8);
      if (iVar2 != 0) goto LAB_0010c3f9;
    }
    if ((void *)uVar1 != (void *)0x0) {
      operator_delete((void *)uVar1,local_8b0._16_8_ - uVar1);
      plVar4 = local_9d8;
    }
    if (plVar4 != (long *)0x0) {
      operator_delete(plVar4,(long)local_9c8 - (long)plVar4);
    }
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_9f8);
    return 0;
  }
LAB_0010c3f9:
  __assert_fail("(kept_ids == std::vector<int64_t>{{ 501, 101, 601 }} )",
                "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp"
                ,0x18b,"int main()");
}

Assistant:

int main()
{
    using namespace example;
   
    alns_t alns{}; // normally these would come from a stream, but for the sake of example will yield from a vec.

    // GeneID:2
    alns.push_back(aln_t{ 101, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // keep.
    alns.push_back(aln_t{ 102, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // duplicate.
    alns.push_back(aln_t{ 103, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000001, 1001000, 100100, 50 }); // not top-scoring for this mrna.
    alns.push_back(aln_t{ 104, 2, {"NM_000001", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // superceded mrna-version.
    alns.push_back(aln_t{ 201, 2, {"NM_000002", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 301, 2, {"NM_000003", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 401, 2, {"NM_000004", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 501, 2, {"NM_000005", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 110}); // keep.
    alns.push_back(aln_t{ 801, 2, {"NM_000008", 1}, {"NC_000001", 1}, 1000000, 1001000, 100200, 100}); // not most-supported-CDS.

    // GeneID:3
    alns.push_back(aln_t{ 601, 3, {"NM_000005", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100});  // keep.
    alns.push_back(aln_t{ 701, 3, {"NM_000007", 1}, {"NT_000001", 1}, 1000000, 1001000, 100100, 100});  // not on NC.
  
    namespace fn = rangeless::fn; 
    using fn::operators::operator%;

    std::vector<int64_t> kept_ids{};

    // we could just std::move(alns) instead of fn::seq(...) here,
    // but demonstrating that input can also be a lazy seq, e.g. deserializing from an istream.
    fn::seq([&, i = 0UL]() mutable -> aln_t
    {
        return i < alns.size() ? std::move(alns[i++]) : fn::end_seq();
    })

  % example::aln_filter

  % fn::for_each( [&](aln_t a)
    {
        std::cerr << a.gene_id << "\t" << a.aln_id << "\n";
        kept_ids.push_back(a.aln_id);
    });

    assert((kept_ids == std::vector<int64_t>{{ 501, 101, 601 }} ));
            
    return 0;
}